

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Hash.c
# Opt level: O3

void update_last(EverCrypt_Hash_state_s *s,uint64_t prev_len,uint8_t *last,uint32_t last_len)

{
  longlong lVar1;
  undefined1 totlen [16];
  undefined1 prev [16];
  undefined1 totlen_00 [16];
  undefined1 prev_00 [16];
  uint32_t rem;
  undefined4 in_register_0000000c;
  uint8_t *d;
  uint8_t *output;
  byte bVar2;
  Spec_Hash_Definitions_hash_alg a;
  uint in_R8D;
  uint64_t *hash;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  Lib_IntVector_Intrinsics_vec128 wv [4];
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  uint64_t local_c0 [23];
  
  bVar2 = (byte)s;
  d = (uint8_t *)CONCAT44(in_register_0000000c,last_len);
  if (0xd < bVar2) {
    update_last_cold_1();
    switch(bVar2) {
    case 0:
      Hacl_Hash_MD5_finish((uint32_t *)prev_len,output);
      return;
    case 1:
      Hacl_Hash_SHA1_finish((uint32_t *)prev_len,output);
      return;
    case 2:
      Hacl_Hash_SHA2_sha224_finish((uint32_t *)prev_len,output);
      return;
    case 3:
      Hacl_Hash_SHA2_sha256_finish((uint32_t *)prev_len,output);
      return;
    case 4:
      Hacl_Hash_SHA2_sha384_finish((uint64_t *)prev_len,output);
      return;
    case 5:
      Hacl_Hash_SHA2_sha512_finish((uint64_t *)prev_len,output);
      return;
    case 6:
      uVar3 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)prev_len)[0];
      uVar4 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)prev_len + 4);
      uVar5 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)prev_len)[1];
      uVar6 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)prev_len + 0xc);
      lVar1 = (*(Lib_IntVector_Intrinsics_vec256 *)prev_len)[2];
      *(int *)(output + 0x18) = (int)(*(Lib_IntVector_Intrinsics_vec256 *)prev_len)[3];
      *(longlong *)(output + 0x10) = lVar1;
      goto LAB_00176199;
    case 7:
      uVar3 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)prev_len)[0];
      uVar4 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)prev_len + 4);
      uVar5 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)prev_len)[1];
      uVar6 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)prev_len + 0xc);
      uVar7 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)prev_len)[2];
      uVar8 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)prev_len + 0x14);
      uVar9 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)prev_len)[3];
      uVar10 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)prev_len + 0x1c);
      goto LAB_00176195;
    case 8:
      uVar3 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)prev_len)[0];
      uVar4 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)prev_len + 4);
      uVar5 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)prev_len)[1];
      uVar6 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)prev_len + 0xc);
      uVar7 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)prev_len)[2];
      uVar8 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)prev_len + 0x14);
      uVar9 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)prev_len)[3];
      uVar10 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)prev_len + 0x1c);
      uVar11 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)(prev_len + 0x20))[0];
      uVar12 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)(prev_len + 0x20) + 4);
      uVar13 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)(prev_len + 0x20))[1];
      uVar14 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)(prev_len + 0x20) + 0xc);
      break;
    case 9:
      uVar3 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)prev_len)[0];
      uVar4 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)prev_len + 4);
      uVar5 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)prev_len)[1];
      uVar6 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)prev_len + 0xc);
      uVar7 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)prev_len)[2];
      uVar8 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)prev_len + 0x14);
      uVar9 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)prev_len)[3];
      uVar10 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)prev_len + 0x1c);
      uVar11 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)(prev_len + 0x20))[0];
      uVar12 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)(prev_len + 0x20) + 4);
      uVar13 = (undefined4)(*(Lib_IntVector_Intrinsics_vec256 *)(prev_len + 0x20))[1];
      uVar14 = *(undefined4 *)((long)*(Lib_IntVector_Intrinsics_vec256 *)(prev_len + 0x20) + 0xc);
      lVar1 = (*(Lib_IntVector_Intrinsics_vec256 *)(prev_len + 0x20))[3];
      *(longlong *)(output + 0x30) = (*(Lib_IntVector_Intrinsics_vec256 *)(prev_len + 0x20))[2];
      *(longlong *)(output + 0x38) = lVar1;
      break;
    case 10:
      Hacl_Hash_Blake2s_finish(0x20,output,(uint32_t *)prev_len);
      return;
    case 0xb:
      Hacl_Hash_Blake2s_Simd128_finish(0x20,output,(Lib_IntVector_Intrinsics_vec128 *)prev_len);
      return;
    case 0xc:
      Hacl_Hash_Blake2b_finish(0x40,output,(uint64_t *)prev_len);
      return;
    case 0xd:
      Hacl_Hash_Blake2b_Simd256_finish(0x40,output,(Lib_IntVector_Intrinsics_vec256 *)prev_len);
      return;
    default:
      finish_cold_1();
      return;
    }
    *(undefined4 *)(output + 0x20) = uVar11;
    *(undefined4 *)(output + 0x24) = uVar12;
    *(undefined4 *)(output + 0x28) = uVar13;
    *(undefined4 *)(output + 0x2c) = uVar14;
LAB_00176195:
    *(undefined4 *)(output + 0x10) = uVar7;
    *(undefined4 *)(output + 0x14) = uVar8;
    *(undefined4 *)(output + 0x18) = uVar9;
    *(undefined4 *)(output + 0x1c) = uVar10;
LAB_00176199:
    *(undefined4 *)output = uVar3;
    *(undefined4 *)(output + 4) = uVar4;
    *(undefined4 *)(output + 8) = uVar5;
    *(undefined4 *)(output + 0xc) = uVar6;
    return;
  }
  hash = (uint64_t *)(ulong)in_R8D;
  rem = (uint32_t)last;
  switch((ulong)s & 0xff) {
  case 0:
    Hacl_Hash_MD5_update_last((uint32_t *)prev_len,(uint64_t)last,d,in_R8D);
    break;
  case 1:
    Hacl_Hash_SHA1_update_last((uint32_t *)prev_len,(uint64_t)last,d,in_R8D);
    break;
  case 2:
    Hacl_Hash_SHA2_sha224_update_last
              ((uint64_t)((long)hash + (long)last),in_R8D,d,(uint32_t *)prev_len);
    break;
  case 3:
    Hacl_Hash_SHA2_sha256_update_last
              ((uint64_t)((long)hash + (long)last),in_R8D,d,(uint32_t *)prev_len);
    break;
  case 4:
    totlen._8_8_ = in_stack_ffffffffffffff28;
    totlen._0_8_ = in_stack_ffffffffffffff20;
    Hacl_Hash_SHA2_sha384_update_last
              ((FStar_UInt128_uint128)totlen,in_R8D + rem,
               (uint8_t *)(ulong)CARRY8((ulong)hash,(ulong)last),hash);
    break;
  case 5:
    totlen_00._8_8_ = in_stack_ffffffffffffff28;
    totlen_00._0_8_ = in_stack_ffffffffffffff20;
    Hacl_Hash_SHA2_sha512_update_last
              ((FStar_UInt128_uint128)totlen_00,in_R8D + rem,
               (uint8_t *)(ulong)CARRY8((ulong)hash,(ulong)last),hash);
    break;
  case 6:
    a = '\t';
    goto LAB_0017609a;
  case 7:
    a = '\b';
    goto LAB_0017609a;
  case 8:
    a = '\n';
    goto LAB_0017609a;
  case 9:
    a = '\v';
LAB_0017609a:
    Hacl_Hash_SHA3_update_last_sha3(a,(uint64_t *)prev_len,d,in_R8D);
    break;
  case 10:
    local_c0[6] = 0;
    local_c0[7] = 0;
    local_c0[4] = 0;
    local_c0[5] = 0;
    local_c0[2] = 0;
    local_c0[3] = 0;
    local_c0[0] = 0;
    local_c0[1] = 0;
    Hacl_Hash_Blake2s_update_last
              (in_R8D,(uint32_t *)local_c0,(uint32_t *)prev_len,(uint64_t)last,in_R8D,d);
    break;
  case 0xb:
    local_c0[6] = 0;
    local_c0[7] = 0;
    local_c0[4] = 0;
    local_c0[5] = 0;
    local_c0[2] = 0;
    local_c0[3] = 0;
    local_c0[0] = 0;
    local_c0[1] = 0;
    Hacl_Hash_Blake2s_Simd128_update_last
              (in_R8D,(Lib_IntVector_Intrinsics_vec128 *)local_c0,
               (Lib_IntVector_Intrinsics_vec128 *)prev_len,(uint64_t)last,in_R8D,d);
    break;
  case 0xc:
    local_c0[0xe] = 0;
    local_c0[0xf] = 0;
    local_c0[0xc] = 0;
    local_c0[0xd] = 0;
    local_c0[10] = 0;
    local_c0[0xb] = 0;
    local_c0[8] = 0;
    local_c0[9] = 0;
    local_c0[6] = 0;
    local_c0[7] = 0;
    local_c0[4] = 0;
    local_c0[5] = 0;
    local_c0[2] = 0;
    local_c0[3] = 0;
    local_c0[0] = 0;
    local_c0[1] = 0;
    prev._8_8_ = in_stack_ffffffffffffff28;
    prev._0_8_ = d;
    Hacl_Hash_Blake2b_update_last
              (in_R8D,local_c0,(uint64_t *)prev_len,(FStar_UInt128_uint128)prev,rem,(uint8_t *)0x0);
    break;
  case 0xd:
    local_c0[0xe] = 0;
    local_c0[0xf] = 0;
    local_c0[0xc] = 0;
    local_c0[0xd] = 0;
    local_c0[10] = 0;
    local_c0[0xb] = 0;
    local_c0[8] = 0;
    local_c0[9] = 0;
    local_c0[6] = 0;
    local_c0[7] = 0;
    local_c0[4] = 0;
    local_c0[5] = 0;
    local_c0[2] = 0;
    local_c0[3] = 0;
    local_c0[0] = 0;
    local_c0[1] = 0;
    prev_00._8_8_ = in_stack_ffffffffffffff28;
    prev_00._0_8_ = d;
    Hacl_Hash_Blake2b_Simd256_update_last
              (in_R8D,(Lib_IntVector_Intrinsics_vec256 *)local_c0,
               (Lib_IntVector_Intrinsics_vec256 *)prev_len,(FStar_UInt128_uint128)prev_00,rem,
               (uint8_t *)0x0);
  }
  return;
}

Assistant:

static void
update_last(EverCrypt_Hash_state_s *s, uint64_t prev_len, uint8_t *last, uint32_t last_len)
{
  EverCrypt_Hash_state_s scrut = *s;
  if (scrut.tag == MD5_s)
  {
    uint32_t *p1 = scrut.case_MD5_s;
    Hacl_Hash_MD5_update_last(p1, prev_len, last, last_len);
    return;
  }
  if (scrut.tag == SHA1_s)
  {
    uint32_t *p1 = scrut.case_SHA1_s;
    Hacl_Hash_SHA1_update_last(p1, prev_len, last, last_len);
    return;
  }
  if (scrut.tag == SHA2_224_s)
  {
    uint32_t *p1 = scrut.case_SHA2_224_s;
    Hacl_Hash_SHA2_sha224_update_last(prev_len + (uint64_t)last_len, last_len, last, p1);
    return;
  }
  if (scrut.tag == SHA2_256_s)
  {
    uint32_t *p1 = scrut.case_SHA2_256_s;
    Hacl_Hash_SHA2_sha256_update_last(prev_len + (uint64_t)last_len, last_len, last, p1);
    return;
  }
  if (scrut.tag == SHA2_384_s)
  {
    uint64_t *p1 = scrut.case_SHA2_384_s;
    Hacl_Hash_SHA2_sha384_update_last(FStar_UInt128_add(FStar_UInt128_uint64_to_uint128(prev_len),
        FStar_UInt128_uint64_to_uint128((uint64_t)last_len)),
      last_len,
      last,
      p1);
    return;
  }
  if (scrut.tag == SHA2_512_s)
  {
    uint64_t *p1 = scrut.case_SHA2_512_s;
    Hacl_Hash_SHA2_sha512_update_last(FStar_UInt128_add(FStar_UInt128_uint64_to_uint128(prev_len),
        FStar_UInt128_uint64_to_uint128((uint64_t)last_len)),
      last_len,
      last,
      p1);
    return;
  }
  if (scrut.tag == SHA3_224_s)
  {
    uint64_t *p1 = scrut.case_SHA3_224_s;
    Hacl_Hash_SHA3_update_last_sha3(Spec_Hash_Definitions_SHA3_224, p1, last, last_len);
    return;
  }
  if (scrut.tag == SHA3_256_s)
  {
    uint64_t *p1 = scrut.case_SHA3_256_s;
    Hacl_Hash_SHA3_update_last_sha3(Spec_Hash_Definitions_SHA3_256, p1, last, last_len);
    return;
  }
  if (scrut.tag == SHA3_384_s)
  {
    uint64_t *p1 = scrut.case_SHA3_384_s;
    Hacl_Hash_SHA3_update_last_sha3(Spec_Hash_Definitions_SHA3_384, p1, last, last_len);
    return;
  }
  if (scrut.tag == SHA3_512_s)
  {
    uint64_t *p1 = scrut.case_SHA3_512_s;
    Hacl_Hash_SHA3_update_last_sha3(Spec_Hash_Definitions_SHA3_512, p1, last, last_len);
    return;
  }
  if (scrut.tag == Blake2S_s)
  {
    uint32_t *p1 = scrut.case_Blake2S_s;
    uint32_t wv[16U] = { 0U };
    Hacl_Hash_Blake2s_update_last(last_len, wv, p1, prev_len, last_len, last);
    return;
  }
  if (scrut.tag == Blake2S_128_s)
  {
    Lib_IntVector_Intrinsics_vec128 *p1 = scrut.case_Blake2S_128_s;
    #if HACL_CAN_COMPILE_VEC128
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 wv[4U] KRML_POST_ALIGN(16) = { 0U };
    Hacl_Hash_Blake2s_Simd128_update_last(last_len, wv, p1, prev_len, last_len, last);
    return;
    #else
    KRML_MAYBE_UNUSED_VAR(p1);
    return;
    #endif
  }
  if (scrut.tag == Blake2B_s)
  {
    uint64_t *p1 = scrut.case_Blake2B_s;
    uint64_t wv[16U] = { 0U };
    Hacl_Hash_Blake2b_update_last(last_len,
      wv,
      p1,
      FStar_UInt128_uint64_to_uint128(prev_len),
      last_len,
      last);
    return;
  }
  if (scrut.tag == Blake2B_256_s)
  {
    Lib_IntVector_Intrinsics_vec256 *p1 = scrut.case_Blake2B_256_s;
    #if HACL_CAN_COMPILE_VEC256
    KRML_PRE_ALIGN(32) Lib_IntVector_Intrinsics_vec256 wv[4U] KRML_POST_ALIGN(32) = { 0U };
    Hacl_Hash_Blake2b_Simd256_update_last(last_len,
      wv,
      p1,
      FStar_UInt128_uint64_to_uint128(prev_len),
      last_len,
      last);
    return;
    #else
    KRML_MAYBE_UNUSED_VAR(p1);
    return;
    #endif
  }
  KRML_HOST_EPRINTF("KaRaMeL abort at %s:%d\n%s\n",
    __FILE__,
    __LINE__,
    "unreachable (pattern matches are exhaustive in F*)");
  KRML_HOST_EXIT(255U);
}